

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

long __thiscall mpt::value_store::element_count(value_store *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = -3;
    if ((*(long *)(lVar1 + 8) != 0) && (uVar2 = *(ulong *)(*(long *)(lVar1 + 8) + 0x10), uVar2 != 0)
       ) {
      return *(ulong *)(lVar1 + 0x18) / uVar2;
    }
  }
  return lVar3;
}

Assistant:

inline T *instance() const
	{ 
		return _ref;
	}